

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O0

void __thiscall
soplex::SPxSolverBase<double>::computePrimalray4Row(SPxSolverBase<double> *this,double direction)

{
  int iVar1;
  undefined4 uVar2;
  UpdateVector<double> *pUVar3;
  SSVectorBase<double> *this_00;
  char *pcVar4;
  int __c;
  SPxSolverBase<double> *in_RDI;
  double in_XMM0_Qa;
  uint uVar5;
  int i;
  double sign;
  undefined4 in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  uint i_00;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint uVar6;
  uint local_1c;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  uVar5 = (uint)(-(ulong)(0.0 < in_XMM0_Qa) >> 0x20);
  SVectorBase<double>::clear((SVectorBase<double> *)0x27d40c);
  pUVar3 = coPvec(in_RDI);
  UpdateVector<double>::delta(pUVar3);
  SSVectorBase<double>::size((SSVectorBase<double> *)0x27d434);
  DSVectorBase<double>::setMax
            ((DSVectorBase<double> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             iVar1);
  local_1c = 0;
  while( true ) {
    uVar6 = local_1c;
    pUVar3 = coPvec(in_RDI);
    UpdateVector<double>::delta(pUVar3);
    iVar1 = SSVectorBase<double>::size((SSVectorBase<double> *)0x27d46a);
    if (iVar1 <= (int)uVar6) break;
    iVar1 = (int)((ulong)&in_RDI->primalRay >> 0x20);
    pUVar3 = coPvec(in_RDI);
    this_00 = UpdateVector<double>::delta(pUVar3);
    pcVar4 = SSVectorBase<double>::index(this_00,(char *)(ulong)local_1c,__c);
    uVar2 = SUB84(pcVar4,0);
    i_00 = ~uVar5 & 0xbff00000 | uVar5 & 0x3ff00000;
    pUVar3 = coPvec(in_RDI);
    UpdateVector<double>::delta(pUVar3);
    SSVectorBase<double>::value
              ((SSVectorBase<double> *)CONCAT44(uVar2,in_stack_ffffffffffffffb0),iVar1);
    DSVectorBase<double>::add
              ((DSVectorBase<double> *)CONCAT44(uVar6,in_stack_ffffffffffffffc0),i_00,
               (double *)CONCAT44(uVar2,in_stack_ffffffffffffffb0));
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computePrimalray4Row(R direction)
{
   R sign = (direction > 0 ? 1.0 : -1.0);

   primalRay.clear();
   primalRay.setMax(coPvec().delta().size());

   for(int i = 0; i < coPvec().delta().size(); ++i)
      primalRay.add(coPvec().delta().index(i), sign * coPvec().delta().value(i));
}